

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiAreaPrivate::QMdiAreaPrivate(QMdiAreaPrivate *this)

{
  QAbstractScrollAreaPrivate::QAbstractScrollAreaPrivate(&this->super_QAbstractScrollAreaPrivate);
  *(undefined ***)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
       = &PTR__QMdiAreaPrivate_007cf770;
  memset(&this->cascader,0,0xb0);
  QBrush::QBrush(&this->background);
  *(undefined8 *)
   ((long)&(this->options).super_QFlagsStorageHelper<QMdiArea::AreaOption,_4>.
           super_QFlagsStorage<QMdiArea::AreaOption>.i + 3) = 0;
  this->activationOrder = CreationOrder;
  this->options = (QFlagsStorageHelper<QMdiArea::AreaOption,_4>)0x0;
  this->tabShape = Rounded;
  this->tabPosition = North;
  this->ignoreGeometryChange = false;
  this->ignoreWindowStateChange = false;
  this->isActivated = false;
  this->isSubWindowsTiled = false;
  this->showActiveWindowMaximized = false;
  this->tileCalledFromResizeEvent = false;
  this->updatesDisabledByUs = false;
  this->inViewModeChange = false;
  this->indexToNextWindow = -1;
  this->indexToPreviousWindow = -1;
  this->indexToHighlighted = -1;
  this->indexToLastActiveTab = -1;
  this->resizeTimer = Invalid;
  this->tabToPreviousTimer = Invalid;
  return;
}

Assistant:

QMdiAreaPrivate::QMdiAreaPrivate()
    : cascader(nullptr),
      regularTiler(nullptr),
      iconTiler(nullptr),
      placer(nullptr),
#if QT_CONFIG(rubberband)
      rubberBand(nullptr),
#endif
#if QT_CONFIG(tabbar)
      tabBar(nullptr),
#endif
      activationOrder(QMdiArea::CreationOrder),
      viewMode(QMdiArea::SubWindowView),
#if QT_CONFIG(tabbar)
      documentMode(false),
      tabsClosable(false),
      tabsMovable(false),
#endif
#if QT_CONFIG(tabwidget)
      tabShape(QTabWidget::Rounded),
      tabPosition(QTabWidget::North),
#endif
      ignoreGeometryChange(false),
      ignoreWindowStateChange(false),
      isActivated(false),
      isSubWindowsTiled(false),
      showActiveWindowMaximized(false),
      tileCalledFromResizeEvent(false),
      updatesDisabledByUs(false),
      inViewModeChange(false),
      indexToNextWindow(-1),
      indexToPreviousWindow(-1),
      indexToHighlighted(-1),
      indexToLastActiveTab(-1)
{
}